

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_spawn.cxx
# Opt level: O3

void __thiscall xray_re::xr_level_spawn::~xr_level_spawn(xr_level_spawn *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  
  this->_vptr_xr_level_spawn = (_func_int **)&PTR__xr_level_spawn_00249e40;
  ppcVar2 = (this->m_spawns).
            super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppcVar1 = (this->m_spawns).
            super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppcVar2 != ppcVar1) {
    do {
      if (*ppcVar2 != (cse_abstract *)0x0) {
        (*(*ppcVar2)->_vptr_cse_abstract[1])();
      }
      ppcVar2 = ppcVar2 + 1;
    } while (ppcVar2 != ppcVar1);
    ppcVar2 = (this->m_spawns).
              super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  if (ppcVar2 != (pointer)0x0) {
    operator_delete(ppcVar2,(long)(this->m_spawns).
                                  super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar2
                   );
    return;
  }
  return;
}

Assistant:

xr_level_spawn::~xr_level_spawn()
{
	delete_elements(m_spawns);
}